

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::copyFrom(UnicodeString *this,UnicodeString *src,UBool fastCopy)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *dest;
  char16_t *src_00;
  int32_t srcLength;
  UBool fastCopy_local;
  UnicodeString *src_local;
  UnicodeString *this_local;
  
  if (this == src) {
    return this;
  }
  UVar1 = isBogus(src);
  if (UVar1 != '\0') {
    setToBogus(this);
    return this;
  }
  releaseArray(this);
  UVar1 = isEmpty(src);
  if (UVar1 != '\0') {
    setToEmpty(this);
    return this;
  }
  (this->fUnion).fStackFields.fLengthAndFlags = (src->fUnion).fStackFields.fLengthAndFlags;
  switch((src->fUnion).fStackFields.fLengthAndFlags & 0x1f) {
  default:
    goto switchD_004860ab_caseD_1;
  case 2:
    iVar2 = getShortLength(this);
    memcpy((void *)((long)&this->fUnion + 2),(void *)((long)&src->fUnion + 2),(long)(iVar2 << 1));
    break;
  case 4:
    addRef(src);
    (this->fUnion).fFields.fArray = (src->fUnion).fFields.fArray;
    (this->fUnion).fFields.fCapacity = (src->fUnion).fFields.fCapacity;
    UVar1 = hasShortLength(this);
    if (UVar1 == '\0') {
      (this->fUnion).fFields.fLength = (src->fUnion).fFields.fLength;
    }
    break;
  case 8:
    if (fastCopy != '\0') {
      (this->fUnion).fFields.fArray = (src->fUnion).fFields.fArray;
      (this->fUnion).fFields.fCapacity = (src->fUnion).fFields.fCapacity;
      UVar1 = hasShortLength(this);
      if (UVar1 != '\0') {
        return this;
      }
      (this->fUnion).fFields.fLength = (src->fUnion).fFields.fLength;
      return this;
    }
  case 0:
    iVar2 = length(src);
    UVar1 = allocate(this,iVar2);
    if (UVar1 == '\0') {
switchD_004860ab_caseD_1:
      (this->fUnion).fStackFields.fLengthAndFlags = 1;
      (this->fUnion).fFields.fArray = (char16_t *)0x0;
      (this->fUnion).fFields.fCapacity = 0;
    }
    else {
      dest = getArrayStart(this);
      src_00 = getArrayStart(src);
      u_memcpy_63(dest,src_00,iVar2);
      setLength(this,iVar2);
    }
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::copyFrom(const UnicodeString &src, UBool fastCopy) {
  // if assigning to ourselves, do nothing
  if(this == &src) {
    return *this;
  }

  // is the right side bogus?
  if(src.isBogus()) {
    setToBogus();
    return *this;
  }

  // delete the current contents
  releaseArray();

  if(src.isEmpty()) {
    // empty string - use the stack buffer
    setToEmpty();
    return *this;
  }

  // fLength>0 and not an "open" src.getBuffer(minCapacity)
  fUnion.fFields.fLengthAndFlags = src.fUnion.fFields.fLengthAndFlags;
  switch(src.fUnion.fFields.fLengthAndFlags & kAllStorageFlags) {
  case kShortString:
    // short string using the stack buffer, do the same
    uprv_memcpy(fUnion.fStackFields.fBuffer, src.fUnion.fStackFields.fBuffer,
                getShortLength() * U_SIZEOF_UCHAR);
    break;
  case kLongString:
    // src uses a refCounted string buffer, use that buffer with refCount
    // src is const, use a cast - we don't actually change it
    ((UnicodeString &)src).addRef();
    // copy all fields, share the reference-counted buffer
    fUnion.fFields.fArray = src.fUnion.fFields.fArray;
    fUnion.fFields.fCapacity = src.fUnion.fFields.fCapacity;
    if(!hasShortLength()) {
      fUnion.fFields.fLength = src.fUnion.fFields.fLength;
    }
    break;
  case kReadonlyAlias:
    if(fastCopy) {
      // src is a readonly alias, do the same
      // -> maintain the readonly alias as such
      fUnion.fFields.fArray = src.fUnion.fFields.fArray;
      fUnion.fFields.fCapacity = src.fUnion.fFields.fCapacity;
      if(!hasShortLength()) {
        fUnion.fFields.fLength = src.fUnion.fFields.fLength;
      }
      break;
    }
    // else if(!fastCopy) fall through to case kWritableAlias
    // -> allocate a new buffer and copy the contents
    U_FALLTHROUGH;
  case kWritableAlias: {
    // src is a writable alias; we make a copy of that instead
    int32_t srcLength = src.length();
    if(allocate(srcLength)) {
      u_memcpy(getArrayStart(), src.getArrayStart(), srcLength);
      setLength(srcLength);
      break;
    }
    // if there is not enough memory, then fall through to setting to bogus
    U_FALLTHROUGH;
  }
  default:
    // if src is bogus, set ourselves to bogus
    // do not call setToBogus() here because fArray and flags are not consistent here
    fUnion.fFields.fLengthAndFlags = kIsBogus;
    fUnion.fFields.fArray = 0;
    fUnion.fFields.fCapacity = 0;
    break;
  }

  return *this;
}